

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mdspan.h
# Opt level: O3

void __thiscall
Gudhi::
Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>::
Simple_mdspan<int>(Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>
                   *this,data_handle_type ptr,int exts)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  array<int,_3UL> aVar5;
  
  this->ptr_ = ptr;
  aVar5 = extents<int,_2UL,_18446744073709551615UL,_2UL>::_init_shifts();
  (this->map_).exts_.dynamic_extents_._M_elems[0] = exts;
  *&(this->map_).exts_.dynamic_extent_shifts_._M_elems = aVar5._M_elems;
  (this->map_).ext_shifts_._M_elems[2] = 1;
  lVar1 = 0;
  do {
    lVar4 = (long)(this->map_).exts_.dynamic_extent_shifts_._M_elems[lVar1 + 2];
    if (lVar4 < 0) {
      iVar3 = *(int *)(&UNK_00110800 + lVar1 * 8);
    }
    else {
      iVar3 = (&(this->map_).exts_.dynamic_extents_)[lVar4]._M_elems[0];
    }
    (this->map_).ext_shifts_._M_elems[lVar1 + 1] =
         iVar3 * (this->map_).ext_shifts_._M_elems[lVar1 + 2];
    lVar1 = lVar1 + -1;
  } while (lVar1 != -2);
  if (ptr == (data_handle_type)0x0) {
    lVar1 = (long)(this->map_).exts_.dynamic_extent_shifts_._M_elems[0];
    if (lVar1 < 0) {
      iVar3 = 2;
    }
    else {
      iVar3 = (&(this->map_).exts_.dynamic_extents_)[lVar1]._M_elems[0];
    }
    if (iVar3 != 0 && (this->map_).ext_shifts_._M_elems[0] != 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "Given pointer is not properly initialized.";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
  }
  return;
}

Assistant:

explicit Simple_mdspan(data_handle_type ptr, IndexTypes... exts)
      : ptr_(ptr), map_(extents_type(exts...))
  {
    GUDHI_CHECK(ptr != nullptr || empty() || Extents::rank() == 0, "Given pointer is not properly initialized.");
  }